

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AmpIO.cpp
# Opt level: O0

bool __thiscall AmpIO::SetMotorVoltage(AmpIO *this,uint index,uint32_t volts)

{
  uint32_t uVar1;
  uint local_24;
  quadlet_t data;
  uint32_t volts_local;
  uint index_local;
  AmpIO *this_local;
  
  if (index < this->NumMotors) {
    uVar1 = BoardIO::GetFirmwareVersion((BoardIO *)this);
    if (uVar1 < 8) {
      this_local._7_1_ = false;
    }
    else {
      local_24 = volts & 0xffff | 0x81000000;
      if (((this->collect_state & 1U) != 0) && ((uint)this->collect_chan == index + 1)) {
        local_24 = volts & 0xffff | 0xc1000000;
      }
      this->WriteBuffer[this->WB_CURR_OFFSET + index] =
           this->WriteBuffer[this->WB_CURR_OFFSET + index] & 0x30000000 | local_24;
      this_local._7_1_ = true;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool AmpIO::SetMotorVoltage(unsigned int index, uint32_t volts)
{
    if (index >= NumMotors)
        return false;
    if (GetFirmwareVersion() < 8)
        return false;
    // Could check MotorConfig to verify that voltage control is available
    // (MCFG_VOLTAGE_CONTROL); firmware will ignore voltage command if voltage
    // control is not available.

    quadlet_t data = VALID_BIT  | (1 << 24) | (volts & DAC_MASK);
    if (collect_state && (collect_chan == (index+1)))
        data |= COLLECT_BIT;
     // Preserve any motor enable bits set by SetAmpEnable
    data |= WriteBuffer[WB_CURR_OFFSET+index]&(MOTOR_ENABLE_MASK|MOTOR_ENABLE_BIT);
    WriteBuffer[WB_CURR_OFFSET+index] = data;
    return true;
}